

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMMapping.c
# Opt level: O0

char * ARM_group_name(csh handle,uint id)

{
  uint id_local;
  csh handle_local;
  
  if ((id < 0x9f) && ((id < 2 || (0x7f < id)))) {
    if (id < 0x80) {
      handle_local = (csh)group_name_maps[id].name;
    }
    else {
      handle_local = (csh)group_name_maps[id - 0x7e].name;
    }
  }
  else {
    handle_local = 0;
  }
  return (char *)handle_local;
}

Assistant:

const char *ARM_group_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	// verify group id
	if (id >= ARM_GRP_ENDING || (id > ARM_GRP_JUMP && id < ARM_GRP_CRYPTO))
		return NULL;

	// NOTE: when new generic groups are added, 2 must be changed accordingly
	if (id >= 128)
		return group_name_maps[id - 128 + 2].name;
	else
		return group_name_maps[id].name;
#else
	return NULL;
#endif
}